

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O2

UBool currency_cleanup(void)

{
  Hashtable *this;
  long lVar1;
  void *in_RSI;
  EVP_PKEY_CTX *in_RDI;
  
  CReg::cleanup(in_RDI);
  for (lVar1 = 0; lVar1 != 0x50; lVar1 = lVar1 + 8) {
    if (*(CurrencyNameCacheEntry **)((long)currCache + lVar1) != (CurrencyNameCacheEntry *)0x0) {
      deleteCacheEntry(*(CurrencyNameCacheEntry **)((long)currCache + lVar1));
      *(undefined8 *)((long)currCache + lVar1) = 0;
    }
  }
  if (gIsoCodes != (UHashtable *)0x0) {
    uhash_close_63(gIsoCodes);
    gIsoCodes = (UHashtable *)0x0;
  }
  this = gCurrSymbolsEquiv;
  LOCK();
  gIsoCodesInitOnce.fState.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  if (gCurrSymbolsEquiv != (Hashtable *)0x0) {
    icu_63::Hashtable::~Hashtable(gCurrSymbolsEquiv);
  }
  icu_63::UMemory::operator_delete((UMemory *)this,in_RSI);
  gCurrSymbolsEquiv = (Hashtable *)0x0;
  LOCK();
  gCurrSymbolsEquivInitOnce.fState.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  return '\x01';
}

Assistant:

U_CDECL_BEGIN
static UBool U_CALLCONV currency_cleanup(void) {
#if !UCONFIG_NO_SERVICE
    CReg::cleanup();
#endif
    /*
     * There might be some cached currency data or isoCodes data.
     */
    currency_cache_cleanup();
    isoCodes_cleanup();
    currSymbolsEquiv_cleanup();

    return TRUE;
}